

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::deinit(SampleMaskCase *this)

{
  ShaderProgram *pSVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SampleMaskCase_conflict *this_local;
  
  if (*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_0x4 != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x480))
              (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_0x4);
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_0x4 = 0;
  }
  if ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x490))
              (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0
    ;
  }
  if (*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length +
              4) != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x438))
              (1,(undefined1 *)
                 ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                         _M_string_length + 4));
    *(undefined4 *)
     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
  }
  if (*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar2) + 0x440))
              (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 = 0;
  }
  if (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) != 0
     ) {
    pSVar1 = *(ShaderProgram **)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8);
    if (pSVar1 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar1);
      operator_delete(pSVar1,0xd0);
    }
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
         = 0;
  }
  if (this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
      _M_allocated_capacity != 0) {
    pSVar1 = (ShaderProgram *)
             this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
             _M_allocated_capacity;
    if (pSVar1 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar1);
      operator_delete(pSVar1,0xd0);
    }
    this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity
         = 0;
  }
  return;
}

Assistant:

void SampleMaskCase::deinit (void)
{
	if (m_texID)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_texID);
		m_texID = 0;
	}
	if (m_vaoID)
	{
		m_context.getRenderContext().getFunctions().deleteVertexArrays(1, &m_vaoID);
		m_vaoID = 0;
	}
	if (m_vboID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_vboID);
		m_vboID = 0;
	}
	if (m_fboID)
	{
		m_context.getRenderContext().getFunctions().deleteFramebuffers(1, &m_fboID);
		m_fboID = 0;
	}

	if (m_samplerProgram)
	{
		delete m_samplerProgram;
		m_samplerProgram = DE_NULL;
	}
	if (m_alphaProgram)
	{
		delete m_alphaProgram;
		m_alphaProgram = DE_NULL;
	}
}